

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  int kk_19;
  float *p0_19;
  int kk_18;
  float *p0_18;
  int kk_17;
  float *p0_17;
  int kk_16;
  float *p0_16;
  int kk_15;
  float *p0_15;
  __m128 _tmp1_8;
  __m128 _tmp0_8;
  __m128 _r1_11;
  __m128 _r0_11;
  int kk_14;
  float *p0_14;
  __m256 _r1_10;
  __m256 _r0_10;
  int kk_13;
  float *p0_13;
  __m512 _r1_9;
  __m512 _r0_9;
  int kk_12;
  float *p0_12;
  int kk_11;
  float *p0_11;
  __m128 tmp0_5;
  __m128 tmp1_5;
  __m128 tmp2_5;
  __m128 tmp3_5;
  __m128 _r3_8;
  __m128 _r2_8;
  __m128 _r1_8;
  __m128 _r0_8;
  int kk_10;
  float *p0_10;
  __m256 _r3_7;
  __m256 _r2_7;
  __m256 _r1_7;
  __m256 _r0_7;
  int kk_9;
  float *p0_9;
  __m512 _r3_6;
  __m512 _r2_6;
  __m512 _r1_6;
  __m512 _r0_6;
  int kk_8;
  float *p0_8;
  int kk_7;
  float *p0_7;
  __m128 tmp0_4;
  __m128 tmp1_4;
  __m128 tmp2_4;
  __m128 tmp3_4;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 _r7_5;
  __m128 _r6_5;
  __m128 _r5_5;
  __m128 _r4_5;
  __m128 _r3_5;
  __m128 _r2_5;
  __m128 _r1_5;
  __m128 _r0_5;
  int kk_6;
  float *p0_6;
  __m256 _r7_4;
  __m256 _r6_4;
  __m256 _r5_4;
  __m256 _r4_4;
  __m256 _r3_4;
  __m256 _r2_4;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_5;
  float *p0_5;
  __m512 _r7_3;
  __m512 _r6_3;
  __m512 _r5_3;
  __m512 _r4_3;
  __m512 _r3_3;
  __m512 _r2_3;
  __m512 _r1_3;
  __m512 _r0_3;
  int kk_4;
  float *p0_4;
  int kk_3;
  float *p0_3;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rb_2;
  __m128 _ra_2;
  __m128 _r9_2;
  __m128 _r8_2;
  __m128 _r7_2;
  __m128 _r6_2;
  __m128 _r5_2;
  __m128 _r4_2;
  __m128 _r3_2;
  __m128 _r2_2;
  __m128 _r1_2;
  __m128 _r0_2;
  int kk_2;
  float *p0_2;
  __m256 _rb_1;
  __m256 _ra_1;
  __m256 _r9_1;
  __m256 _r8_1;
  __m256 _r7_1;
  __m256 _r6_1;
  __m256 _r5_1;
  __m256 _r4_1;
  __m256 _r3_1;
  __m256 _r2_1;
  __m256 _r1_1;
  __m256 _r0_1;
  int kk_1;
  float *p0_1;
  __m512 _rb;
  __m512 _ra;
  __m512 _r9;
  __m512 _r8;
  __m512 _r7;
  __m512 _r6;
  __m512 _r5;
  __m512 _r4;
  __m512 _r3;
  __m512 _r2;
  __m512 _r1;
  __m512 _r0;
  int kk;
  float *p0;
  int jj;
  float *pp;
  int B_hstep;
  int elempack;
  __m512 _tmpf_2;
  __m512 _tmpe_2;
  __m512 _tmpd_2;
  __m512 _tmpc_2;
  __m512 _tmpb_2;
  __m512 _tmpa_2;
  __m512 _tmp9_2;
  __m512 _tmp8_2;
  __m512 _tmp7_2;
  __m512 _tmp6_2;
  __m512 _tmp5_2;
  __m512 _tmp4_2;
  __m512 _tmp3_2;
  __m512 _tmp2_2;
  __m512 _tmp1_2;
  __m512 _tmp0_2;
  __m256 _tmpf_3;
  __m256 _tmpe_3;
  __m256 _tmpd_3;
  __m256 _tmpc_3;
  __m256 _tmpb_3;
  __m256 _tmpa_3;
  __m256 _tmp9_3;
  __m256 _tmp8_3;
  __m256 _tmp7_3;
  __m256 _tmp6_3;
  __m256 _tmp5_3;
  __m256 _tmp4_3;
  __m256 _tmp3_3;
  __m256 _tmp2_3;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m512 _tmp7_4;
  __m512 _tmp6_4;
  __m512 _tmp5_4;
  __m512 _tmp4_4;
  __m512 _tmp3_4;
  __m512 _tmp2_4;
  __m512 _tmp1_4;
  __m512 _tmp0_4;
  __m256 _tmp7_5;
  __m256 _tmp6_5;
  __m256 _tmp5_5;
  __m256 _tmp4_5;
  __m256 _tmp3_5;
  __m256 _tmp2_5;
  __m256 _tmp1_5;
  __m256 _tmp0_5;
  __m512 _tmp3_6;
  __m512 _tmp2_6;
  __m512 _tmp1_6;
  __m512 _tmp0_6;
  __m256 _tmp1_7;
  __m256 _tmp0_7;
  __m256 _tmpn_1;
  __m256 _tmpm_1;
  __m256 _tmpl_1;
  __m256 _tmpk_1;
  __m256 _tmpj_1;
  __m256 _tmpi_1;
  __m256 _tmph_1;
  __m256 _tmpg_1;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m512 _tmpn;
  __m512 _tmpm;
  __m512 _tmpl;
  __m512 _tmpk;
  __m512 _tmpj;
  __m512 _tmpi;
  __m512 _tmph;
  __m512 _tmpg;
  __m512 _tmpf;
  __m512 _tmpe;
  __m512 _tmpd;
  __m512 _tmpc;
  __m512 _tmpb;
  __m512 _tmpa;
  __m512 _tmp9;
  __m512 _tmp8;
  __m512 _tmp7;
  __m512 _tmp6;
  __m512 _tmp5;
  __m512 _tmp4;
  __m512 _tmp3;
  __m512 _tmp2;
  __m512 _tmp1;
  __m512 _tmp0;
  int local_5ac0;
  int local_5abc;
  undefined4 *local_5ab8;
  int local_5aac;
  undefined1 (*local_5aa8) [16];
  int local_5a9c;
  undefined1 (*local_5a98) [32];
  int local_5a8c;
  undefined1 (*local_5a88) [64];
  int local_5a7c;
  undefined4 *local_5a78;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  int local_5a2c;
  undefined1 (*local_5a28) [16];
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  int local_59cc;
  undefined1 (*local_59c8) [32];
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 uStack_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  int local_590c;
  undefined1 (*local_5908) [64];
  int local_58fc;
  undefined1 (*local_58f8) [16];
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 local_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  int local_586c;
  undefined1 (*local_5868) [16];
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  int local_57cc;
  undefined1 (*local_57c8) [32];
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 uStack_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 uStack_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 uStack_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  int local_568c;
  undefined1 (*local_5688) [64];
  int local_567c;
  undefined8 *local_5678;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 local_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 local_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 local_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  int local_556c;
  undefined1 (*local_5568) [16];
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  int local_544c;
  undefined1 (*local_5448) [32];
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 uStack_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 uStack_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 uStack_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 uStack_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 uStack_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 uStack_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 uStack_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  int local_520c;
  undefined1 (*local_5208) [64];
  int local_51fc;
  undefined8 *local_51f8;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 local_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 local_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 local_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 local_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 local_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  int local_506c;
  undefined1 (*local_5068) [16];
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  int local_4ecc;
  undefined1 (*local_4ec8) [32];
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 uStack_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 uStack_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 uStack_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 uStack_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 uStack_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 uStack_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 uStack_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  int local_4b84;
  undefined1 (*local_4b80) [64];
  int local_4b74;
  undefined1 (*local_4b70) [64];
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_5ac0 = (int)in_RDI[8];
  }
  else {
    local_5ac0 = *(int *)((long)in_RDI + 0x2c);
  }
  local_4b70 = (undefined1 (*) [64])*in_RSI;
  for (local_4b74 = 0; local_4b74 + 0xb < in_ECX; local_4b74 = local_4b74 + 0xc) {
    if (iVar1 == 0x10) {
      local_4b80 = (undefined1 (*) [64])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 0x10) * 4);
      for (local_4b84 = 0; local_4b84 + 0xf < in_R9D; local_4b84 = local_4b84 + 0x10) {
        auVar30 = vunpcklps_avx512f(*local_4b80,local_4b80[1]);
        auVar31 = vunpckhps_avx512f(*local_4b80,local_4b80[1]);
        auVar32 = vunpcklps_avx512f(local_4b80[2],local_4b80[3]);
        auVar33 = vunpckhps_avx512f(local_4b80[2],local_4b80[3]);
        auVar34 = vunpcklps_avx512f(local_4b80[4],local_4b80[5]);
        auVar35 = vunpckhps_avx512f(local_4b80[4],local_4b80[5]);
        auVar36 = vunpcklps_avx512f(local_4b80[6],local_4b80[7]);
        auVar37 = vunpckhps_avx512f(local_4b80[6],local_4b80[7]);
        auVar38 = vunpcklps_avx512f(local_4b80[8],local_4b80[9]);
        auVar39 = vunpckhps_avx512f(local_4b80[8],local_4b80[9]);
        auVar40 = vunpcklps_avx512f(local_4b80[10],local_4b80[0xb]);
        auVar41 = vunpckhps_avx512f(local_4b80[10],local_4b80[0xb]);
        auVar42 = vunpcklpd_avx512f(auVar30,auVar32);
        auVar30 = vunpckhpd_avx512f(auVar30,auVar32);
        auVar32 = vunpcklpd_avx512f(auVar31,auVar33);
        auVar31 = vunpckhpd_avx512f(auVar31,auVar33);
        auVar33 = vunpcklpd_avx512f(auVar34,auVar36);
        auVar34 = vunpckhpd_avx512f(auVar34,auVar36);
        auVar36 = vunpcklpd_avx512f(auVar35,auVar37);
        auVar35 = vunpckhpd_avx512f(auVar35,auVar37);
        auVar37 = vunpcklpd_avx512f(auVar38,auVar40);
        auVar38 = vunpckhpd_avx512f(auVar38,auVar40);
        auVar40 = vunpcklpd_avx512f(auVar39,auVar41);
        auVar39 = vunpckhpd_avx512f(auVar39,auVar41);
        auVar41 = vshuff64x2_avx512f(auVar42,auVar33,0x88);
        auVar43 = vshuff64x2_avx512f(auVar37,auVar30,0x88);
        auVar44 = vshuff64x2_avx512f(auVar34,auVar38,0x88);
        auVar45 = vshuff64x2_avx512f(auVar32,auVar36,0x88);
        auVar46 = vshuff64x2_avx512f(auVar40,auVar31,0x88);
        auVar47 = vshuff64x2_avx512f(auVar35,auVar39,0x88);
        auVar33 = vshuff64x2_avx512f(auVar42,auVar33,0xdd);
        auVar30 = vshuff64x2_avx512f(auVar37,auVar30,0xdd);
        auVar34 = vshuff64x2_avx512f(auVar34,auVar38,0xdd);
        auVar32 = vshuff64x2_avx512f(auVar32,auVar36,0xdd);
        auVar31 = vshuff64x2_avx512f(auVar40,auVar31,0xdd);
        auVar35 = vshuff64x2_avx512f(auVar35,auVar39,0xdd);
        auVar36 = vshuff64x2_avx512f(auVar41,auVar43,0x88);
        auVar37 = vshuff64x2_avx512f(auVar44,auVar45,0x88);
        uStack_4c08 = auVar37._56_8_;
        uStack_4c10 = auVar37._48_8_;
        uStack_4c18 = auVar37._40_8_;
        uStack_4c20 = auVar37._32_8_;
        uStack_4c28 = auVar37._24_8_;
        uStack_4c30 = auVar37._16_8_;
        uStack_4c38 = auVar37._8_8_;
        local_4c40 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar46,auVar47,0x88);
        uStack_4c48 = auVar37._56_8_;
        uStack_4c50 = auVar37._48_8_;
        uStack_4c58 = auVar37._40_8_;
        uStack_4c60 = auVar37._32_8_;
        uStack_4c68 = auVar37._24_8_;
        uStack_4c70 = auVar37._16_8_;
        uStack_4c78 = auVar37._8_8_;
        local_4c80 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar33,auVar30,0x88);
        uStack_4c88 = auVar37._56_8_;
        uStack_4c90 = auVar37._48_8_;
        uStack_4c98 = auVar37._40_8_;
        uStack_4ca0 = auVar37._32_8_;
        uStack_4ca8 = auVar37._24_8_;
        uStack_4cb0 = auVar37._16_8_;
        uStack_4cb8 = auVar37._8_8_;
        local_4cc0 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar34,auVar32,0x88);
        uStack_4cc8 = auVar37._56_8_;
        uStack_4cd0 = auVar37._48_8_;
        uStack_4cd8 = auVar37._40_8_;
        uStack_4ce0 = auVar37._32_8_;
        uStack_4ce8 = auVar37._24_8_;
        uStack_4cf0 = auVar37._16_8_;
        uStack_4cf8 = auVar37._8_8_;
        local_4d00 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar31,auVar35,0x88);
        uStack_4d08 = auVar37._56_8_;
        uStack_4d10 = auVar37._48_8_;
        uStack_4d18 = auVar37._40_8_;
        uStack_4d20 = auVar37._32_8_;
        uStack_4d28 = auVar37._24_8_;
        uStack_4d30 = auVar37._16_8_;
        uStack_4d38 = auVar37._8_8_;
        local_4d40 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar41,auVar43,0xdd);
        uStack_4d48 = auVar37._56_8_;
        uStack_4d50 = auVar37._48_8_;
        uStack_4d58 = auVar37._40_8_;
        uStack_4d60 = auVar37._32_8_;
        uStack_4d68 = auVar37._24_8_;
        uStack_4d70 = auVar37._16_8_;
        uStack_4d78 = auVar37._8_8_;
        local_4d80 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar44,auVar45,0xdd);
        uStack_4d88 = auVar37._56_8_;
        uStack_4d90 = auVar37._48_8_;
        uStack_4d98 = auVar37._40_8_;
        uStack_4da0 = auVar37._32_8_;
        uStack_4da8 = auVar37._24_8_;
        uStack_4db0 = auVar37._16_8_;
        uStack_4db8 = auVar37._8_8_;
        local_4dc0 = auVar37._0_8_;
        auVar37 = vshuff64x2_avx512f(auVar46,auVar47,0xdd);
        uStack_4dc8 = auVar37._56_8_;
        uStack_4dd0 = auVar37._48_8_;
        uStack_4dd8 = auVar37._40_8_;
        uStack_4de0 = auVar37._32_8_;
        uStack_4de8 = auVar37._24_8_;
        uStack_4df0 = auVar37._16_8_;
        uStack_4df8 = auVar37._8_8_;
        local_4e00 = auVar37._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar33,auVar30,0xdd);
        uStack_4e08 = auVar30._56_8_;
        uStack_4e10 = auVar30._48_8_;
        uStack_4e18 = auVar30._40_8_;
        uStack_4e20 = auVar30._32_8_;
        uStack_4e28 = auVar30._24_8_;
        uStack_4e30 = auVar30._16_8_;
        uStack_4e38 = auVar30._8_8_;
        local_4e40 = auVar30._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar34,auVar32,0xdd);
        uStack_4e48 = auVar30._56_8_;
        uStack_4e50 = auVar30._48_8_;
        uStack_4e58 = auVar30._40_8_;
        uStack_4e60 = auVar30._32_8_;
        uStack_4e68 = auVar30._24_8_;
        uStack_4e70 = auVar30._16_8_;
        uStack_4e78 = auVar30._8_8_;
        local_4e80 = auVar30._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar31,auVar35,0xdd);
        uStack_4bc8 = auVar36._56_8_;
        uStack_4bd0 = auVar36._48_8_;
        uStack_4bd8 = auVar36._40_8_;
        uStack_4be0 = auVar36._32_8_;
        uStack_4be8 = auVar36._24_8_;
        uStack_4bf0 = auVar36._16_8_;
        uStack_4bf8 = auVar36._8_8_;
        local_4c00 = auVar36._0_8_;
        *(undefined8 *)*local_4b70 = local_4c00;
        *(undefined8 *)(*local_4b70 + 8) = uStack_4bf8;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_4bf0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_4be8;
        *(undefined8 *)(*local_4b70 + 0x20) = uStack_4be0;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_4bd8;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_4bd0;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_4bc8;
        *(undefined8 *)local_4b70[1] = local_4c40;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_4c38;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_4c30;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_4c28;
        *(undefined8 *)(local_4b70[1] + 0x20) = uStack_4c20;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_4c18;
        *(undefined8 *)(local_4b70[1] + 0x30) = uStack_4c10;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_4c08;
        *(undefined8 *)local_4b70[2] = local_4c80;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_4c78;
        *(undefined8 *)(local_4b70[2] + 0x10) = uStack_4c70;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_4c68;
        *(undefined8 *)(local_4b70[2] + 0x20) = uStack_4c60;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_4c58;
        *(undefined8 *)(local_4b70[2] + 0x30) = uStack_4c50;
        *(undefined8 *)(local_4b70[2] + 0x38) = uStack_4c48;
        *(undefined8 *)local_4b70[3] = local_4cc0;
        *(undefined8 *)(local_4b70[3] + 8) = uStack_4cb8;
        *(undefined8 *)(local_4b70[3] + 0x10) = uStack_4cb0;
        *(undefined8 *)(local_4b70[3] + 0x18) = uStack_4ca8;
        *(undefined8 *)(local_4b70[3] + 0x20) = uStack_4ca0;
        *(undefined8 *)(local_4b70[3] + 0x28) = uStack_4c98;
        *(undefined8 *)(local_4b70[3] + 0x30) = uStack_4c90;
        *(undefined8 *)(local_4b70[3] + 0x38) = uStack_4c88;
        *(undefined8 *)local_4b70[4] = local_4d00;
        *(undefined8 *)(local_4b70[4] + 8) = uStack_4cf8;
        *(undefined8 *)(local_4b70[4] + 0x10) = uStack_4cf0;
        *(undefined8 *)(local_4b70[4] + 0x18) = uStack_4ce8;
        *(undefined8 *)(local_4b70[4] + 0x20) = uStack_4ce0;
        *(undefined8 *)(local_4b70[4] + 0x28) = uStack_4cd8;
        *(undefined8 *)(local_4b70[4] + 0x30) = uStack_4cd0;
        *(undefined8 *)(local_4b70[4] + 0x38) = uStack_4cc8;
        *(undefined8 *)local_4b70[5] = local_4d40;
        *(undefined8 *)(local_4b70[5] + 8) = uStack_4d38;
        *(undefined8 *)(local_4b70[5] + 0x10) = uStack_4d30;
        *(undefined8 *)(local_4b70[5] + 0x18) = uStack_4d28;
        *(undefined8 *)(local_4b70[5] + 0x20) = uStack_4d20;
        *(undefined8 *)(local_4b70[5] + 0x28) = uStack_4d18;
        *(undefined8 *)(local_4b70[5] + 0x30) = uStack_4d10;
        *(undefined8 *)(local_4b70[5] + 0x38) = uStack_4d08;
        *(undefined8 *)local_4b70[6] = local_4d80;
        *(undefined8 *)(local_4b70[6] + 8) = uStack_4d78;
        *(undefined8 *)(local_4b70[6] + 0x10) = uStack_4d70;
        *(undefined8 *)(local_4b70[6] + 0x18) = uStack_4d68;
        *(undefined8 *)(local_4b70[6] + 0x20) = uStack_4d60;
        *(undefined8 *)(local_4b70[6] + 0x28) = uStack_4d58;
        *(undefined8 *)(local_4b70[6] + 0x30) = uStack_4d50;
        *(undefined8 *)(local_4b70[6] + 0x38) = uStack_4d48;
        *(undefined8 *)local_4b70[7] = local_4dc0;
        *(undefined8 *)(local_4b70[7] + 8) = uStack_4db8;
        *(undefined8 *)(local_4b70[7] + 0x10) = uStack_4db0;
        *(undefined8 *)(local_4b70[7] + 0x18) = uStack_4da8;
        *(undefined8 *)(local_4b70[7] + 0x20) = uStack_4da0;
        *(undefined8 *)(local_4b70[7] + 0x28) = uStack_4d98;
        *(undefined8 *)(local_4b70[7] + 0x30) = uStack_4d90;
        *(undefined8 *)(local_4b70[7] + 0x38) = uStack_4d88;
        *(undefined8 *)local_4b70[8] = local_4e00;
        *(undefined8 *)(local_4b70[8] + 8) = uStack_4df8;
        *(undefined8 *)(local_4b70[8] + 0x10) = uStack_4df0;
        *(undefined8 *)(local_4b70[8] + 0x18) = uStack_4de8;
        *(undefined8 *)(local_4b70[8] + 0x20) = uStack_4de0;
        *(undefined8 *)(local_4b70[8] + 0x28) = uStack_4dd8;
        *(undefined8 *)(local_4b70[8] + 0x30) = uStack_4dd0;
        *(undefined8 *)(local_4b70[8] + 0x38) = uStack_4dc8;
        *(undefined8 *)local_4b70[9] = local_4e40;
        *(undefined8 *)(local_4b70[9] + 8) = uStack_4e38;
        *(undefined8 *)(local_4b70[9] + 0x10) = uStack_4e30;
        *(undefined8 *)(local_4b70[9] + 0x18) = uStack_4e28;
        *(undefined8 *)(local_4b70[9] + 0x20) = uStack_4e20;
        *(undefined8 *)(local_4b70[9] + 0x28) = uStack_4e18;
        *(undefined8 *)(local_4b70[9] + 0x30) = uStack_4e10;
        *(undefined8 *)(local_4b70[9] + 0x38) = uStack_4e08;
        *(undefined8 *)local_4b70[10] = local_4e80;
        *(undefined8 *)(local_4b70[10] + 8) = uStack_4e78;
        *(undefined8 *)(local_4b70[10] + 0x10) = uStack_4e70;
        *(undefined8 *)(local_4b70[10] + 0x18) = uStack_4e68;
        *(undefined8 *)(local_4b70[10] + 0x20) = uStack_4e60;
        *(undefined8 *)(local_4b70[10] + 0x28) = uStack_4e58;
        *(undefined8 *)(local_4b70[10] + 0x30) = uStack_4e50;
        *(undefined8 *)(local_4b70[10] + 0x38) = uStack_4e48;
        local_4b70[0xb] = auVar30;
        local_4b70 = local_4b70 + 0xc;
        local_4b80 = (undefined1 (*) [64])(*local_4b80 + (long)(local_5ac0 << 4) * 4);
      }
    }
    if (iVar1 == 8) {
      local_4ec8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 8) * 4);
      for (local_4ecc = 0; local_4ecc + 7 < in_R9D; local_4ecc = local_4ecc + 8) {
        auVar23 = vunpcklps_avx(*local_4ec8,local_4ec8[1]);
        auVar6 = vunpckhps_avx(*local_4ec8,local_4ec8[1]);
        auVar24 = vunpcklps_avx(local_4ec8[2],local_4ec8[3]);
        auVar7 = vunpckhps_avx(local_4ec8[2],local_4ec8[3]);
        auVar25 = vunpcklps_avx(local_4ec8[4],local_4ec8[5]);
        auVar8 = vunpckhps_avx(local_4ec8[4],local_4ec8[5]);
        auVar26 = vunpcklps_avx(local_4ec8[6],local_4ec8[7]);
        auVar9 = vunpckhps_avx(local_4ec8[6],local_4ec8[7]);
        auVar27 = vunpcklps_avx(local_4ec8[8],local_4ec8[9]);
        auVar10 = vunpckhps_avx(local_4ec8[8],local_4ec8[9]);
        auVar28 = vunpcklps_avx(local_4ec8[10],local_4ec8[0xb]);
        auVar11 = vunpckhps_avx(local_4ec8[10],local_4ec8[0xb]);
        auVar17 = vunpcklpd_avx(auVar23,auVar24);
        auVar23 = vunpckhpd_avx(auVar23,auVar24);
        auVar24 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar18 = vunpcklpd_avx(auVar25,auVar26);
        auVar7 = vunpckhpd_avx(auVar25,auVar26);
        auVar25 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar26 = vunpcklpd_avx(auVar27,auVar28);
        auVar9 = vunpckhpd_avx(auVar27,auVar28);
        auVar27 = vunpcklpd_avx(auVar10,auVar11);
        auVar10 = vunpckhpd_avx(auVar10,auVar11);
        auVar11 = vperm2f128_avx(auVar17,auVar18,0x20);
        auVar28 = vperm2f128_avx(auVar26,auVar23,0x20);
        uStack_4f08 = auVar28._24_8_;
        uStack_4f10 = auVar28._16_8_;
        uStack_4f18 = auVar28._8_8_;
        local_4f20 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar7,auVar9,0x20);
        uStack_4f28 = auVar28._24_8_;
        uStack_4f30 = auVar28._16_8_;
        uStack_4f38 = auVar28._8_8_;
        local_4f40 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar24,auVar25,0x20);
        uStack_4f48 = auVar28._24_8_;
        uStack_4f50 = auVar28._16_8_;
        uStack_4f58 = auVar28._8_8_;
        local_4f60 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar27,auVar6,0x20);
        uStack_4f68 = auVar28._24_8_;
        uStack_4f70 = auVar28._16_8_;
        uStack_4f78 = auVar28._8_8_;
        local_4f80 = auVar28._0_8_;
        auVar28 = vperm2f128_avx(auVar8,auVar10,0x20);
        uStack_4f88 = auVar28._24_8_;
        uStack_4f90 = auVar28._16_8_;
        uStack_4f98 = auVar28._8_8_;
        local_4fa0 = auVar28._0_8_;
        auVar17 = vperm2f128_avx(auVar17,auVar18,0x31);
        uStack_4fa8 = auVar17._24_8_;
        uStack_4fb0 = auVar17._16_8_;
        uStack_4fb8 = auVar17._8_8_;
        local_4fc0 = auVar17._0_8_;
        auVar23 = vperm2f128_avx(auVar26,auVar23,0x31);
        uStack_4fc8 = auVar23._24_8_;
        uStack_4fd0 = auVar23._16_8_;
        uStack_4fd8 = auVar23._8_8_;
        local_4fe0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar7,auVar9,0x31);
        uStack_4fe8 = auVar23._24_8_;
        uStack_4ff0 = auVar23._16_8_;
        uStack_4ff8 = auVar23._8_8_;
        local_5000 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar24,auVar25,0x31);
        uStack_5008 = auVar23._24_8_;
        uStack_5010 = auVar23._16_8_;
        uStack_5018 = auVar23._8_8_;
        local_5020 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar27,auVar6,0x31);
        uStack_5028 = auVar23._24_8_;
        uStack_5030 = auVar23._16_8_;
        uStack_5038 = auVar23._8_8_;
        local_5040 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar10,0x31);
        uStack_4ee8 = auVar11._24_8_;
        uStack_4ef0 = auVar11._16_8_;
        uStack_4ef8 = auVar11._8_8_;
        local_4f00 = auVar11._0_8_;
        *(undefined8 *)*local_4b70 = local_4f00;
        *(undefined8 *)(*local_4b70 + 8) = uStack_4ef8;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_4ef0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_4ee8;
        *(undefined8 *)(*local_4b70 + 0x20) = local_4f20;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_4f18;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_4f10;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_4f08;
        *(undefined8 *)local_4b70[1] = local_4f40;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_4f38;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_4f30;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_4f28;
        *(undefined8 *)(local_4b70[1] + 0x20) = local_4f60;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_4f58;
        *(undefined8 *)(local_4b70[1] + 0x30) = uStack_4f50;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_4f48;
        *(undefined8 *)local_4b70[2] = local_4f80;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_4f78;
        *(undefined8 *)(local_4b70[2] + 0x10) = uStack_4f70;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_4f68;
        *(undefined8 *)(local_4b70[2] + 0x20) = local_4fa0;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_4f98;
        *(undefined8 *)(local_4b70[2] + 0x30) = uStack_4f90;
        *(undefined8 *)(local_4b70[2] + 0x38) = uStack_4f88;
        *(undefined8 *)local_4b70[3] = local_4fc0;
        *(undefined8 *)(local_4b70[3] + 8) = uStack_4fb8;
        *(undefined8 *)(local_4b70[3] + 0x10) = uStack_4fb0;
        *(undefined8 *)(local_4b70[3] + 0x18) = uStack_4fa8;
        *(undefined8 *)(local_4b70[3] + 0x20) = local_4fe0;
        *(undefined8 *)(local_4b70[3] + 0x28) = uStack_4fd8;
        *(undefined8 *)(local_4b70[3] + 0x30) = uStack_4fd0;
        *(undefined8 *)(local_4b70[3] + 0x38) = uStack_4fc8;
        *(undefined8 *)local_4b70[4] = local_5000;
        *(undefined8 *)(local_4b70[4] + 8) = uStack_4ff8;
        *(undefined8 *)(local_4b70[4] + 0x10) = uStack_4ff0;
        *(undefined8 *)(local_4b70[4] + 0x18) = uStack_4fe8;
        *(undefined8 *)(local_4b70[4] + 0x20) = local_5020;
        *(undefined8 *)(local_4b70[4] + 0x28) = uStack_5018;
        *(undefined8 *)(local_4b70[4] + 0x30) = uStack_5010;
        *(undefined8 *)(local_4b70[4] + 0x38) = uStack_5008;
        *(undefined8 *)local_4b70[5] = local_5040;
        *(undefined8 *)(local_4b70[5] + 8) = uStack_5038;
        *(undefined8 *)(local_4b70[5] + 0x10) = uStack_5030;
        *(undefined8 *)(local_4b70[5] + 0x18) = uStack_5028;
        *(undefined1 (*) [32])(local_4b70[5] + 0x20) = auVar23;
        local_4b70 = local_4b70 + 6;
        local_4ec8 = (undefined1 (*) [32])(*local_4ec8 + (long)(local_5ac0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_5068 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 4) * 4);
      for (local_506c = 0; local_506c + 3 < in_R9D; local_506c = local_506c + 4) {
        auVar19 = vunpcklps_avx(*local_5068,local_5068[1]);
        auVar20 = vunpcklps_avx(local_5068[2],local_5068[3]);
        auVar2 = vunpckhps_avx(*local_5068,local_5068[1]);
        auVar3 = vunpckhps_avx(local_5068[2],local_5068[3]);
        auVar12 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar13 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(local_5068[4],local_5068[5]);
        auVar21 = vunpcklps_avx(local_5068[6],local_5068[7]);
        auVar20 = vunpckhps_avx(local_5068[4],local_5068[5]);
        auVar4 = vunpckhps_avx(local_5068[6],local_5068[7]);
        auVar14 = vunpcklpd_avx(auVar3,auVar21);
        auVar3 = vunpckhpd_avx(auVar3,auVar21);
        auVar15 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        auVar4 = vunpcklps_avx(local_5068[8],local_5068[9]);
        auVar22 = vunpcklps_avx(local_5068[10],local_5068[0xb]);
        auVar21 = vunpckhps_avx(local_5068[8],local_5068[9]);
        auVar5 = vunpckhps_avx(local_5068[10],local_5068[0xb]);
        auVar16 = vunpcklpd_avx(auVar4,auVar22);
        auVar4 = vunpckhpd_avx(auVar4,auVar22);
        auVar22 = vunpcklpd_avx(auVar21,auVar5);
        auVar21 = vunpckhpd_avx(auVar21,auVar5);
        local_5080 = auVar12._0_8_;
        uStack_5078 = auVar12._8_8_;
        *(undefined8 *)*local_4b70 = local_5080;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5078;
        local_50c0 = auVar14._0_8_;
        uStack_50b8 = auVar14._8_8_;
        *(undefined8 *)(*local_4b70 + 0x10) = local_50c0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_50b8;
        local_5100 = auVar16._0_8_;
        uStack_50f8 = auVar16._8_8_;
        *(undefined8 *)(*local_4b70 + 0x20) = local_5100;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_50f8;
        local_5090 = auVar19._0_8_;
        uStack_5088 = auVar19._8_8_;
        *(undefined8 *)(*local_4b70 + 0x30) = local_5090;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_5088;
        local_50d0 = auVar3._0_8_;
        uStack_50c8 = auVar3._8_8_;
        *(undefined8 *)local_4b70[1] = local_50d0;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_50c8;
        local_5110 = auVar4._0_8_;
        uStack_5108 = auVar4._8_8_;
        *(undefined8 *)(local_4b70[1] + 0x10) = local_5110;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_5108;
        local_50a0 = auVar13._0_8_;
        uStack_5098 = auVar13._8_8_;
        *(undefined8 *)(local_4b70[1] + 0x20) = local_50a0;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_5098;
        local_50e0 = auVar15._0_8_;
        uStack_50d8 = auVar15._8_8_;
        *(undefined8 *)(local_4b70[1] + 0x30) = local_50e0;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_50d8;
        local_5120 = auVar22._0_8_;
        uStack_5118 = auVar22._8_8_;
        *(undefined8 *)local_4b70[2] = local_5120;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_5118;
        local_50b0 = auVar2._0_8_;
        uStack_50a8 = auVar2._8_8_;
        *(undefined8 *)(local_4b70[2] + 0x10) = local_50b0;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_50a8;
        local_50f0 = auVar20._0_8_;
        uStack_50e8 = auVar20._8_8_;
        *(undefined8 *)(local_4b70[2] + 0x20) = local_50f0;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_50e8;
        *(undefined1 (*) [16])(local_4b70[2] + 0x30) = auVar21;
        local_4b70 = local_4b70 + 3;
        local_5068 = (undefined1 (*) [16])(*local_5068 + (long)(local_5ac0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_51f8 = (undefined8 *)
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 + (long)(in_EDX + local_4b74) * 4);
      for (local_51fc = 0; local_51fc < in_R9D; local_51fc = local_51fc + 1) {
        uVar29 = local_51f8[1];
        *(undefined8 *)*local_4b70 = *local_51f8;
        *(undefined8 *)(*local_4b70 + 8) = uVar29;
        uVar29 = local_51f8[3];
        *(undefined8 *)(*local_4b70 + 0x10) = local_51f8[2];
        *(undefined8 *)(*local_4b70 + 0x18) = uVar29;
        *(undefined1 (*) [16])(*local_4b70 + 0x20) = *(undefined1 (*) [16])(local_51f8 + 4);
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x30);
        local_51f8 = (undefined8 *)((long)local_51f8 + (long)local_5ac0 * 4);
      }
    }
  }
  for (; local_4b74 + 7 < in_ECX; local_4b74 = local_4b74 + 8) {
    if (iVar1 == 0x10) {
      local_5208 = (undefined1 (*) [64])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 0x10) * 4);
      for (local_520c = 0; local_520c + 0xf < in_R9D; local_520c = local_520c + 0x10) {
        auVar30 = vunpcklps_avx512f(*local_5208,local_5208[1]);
        auVar31 = vunpckhps_avx512f(*local_5208,local_5208[1]);
        auVar32 = vunpcklps_avx512f(local_5208[2],local_5208[3]);
        auVar33 = vunpckhps_avx512f(local_5208[2],local_5208[3]);
        auVar34 = vunpcklps_avx512f(local_5208[4],local_5208[5]);
        auVar35 = vunpckhps_avx512f(local_5208[4],local_5208[5]);
        auVar36 = vunpcklps_avx512f(local_5208[6],local_5208[7]);
        auVar37 = vunpckhps_avx512f(local_5208[6],local_5208[7]);
        auVar38 = vunpcklpd_avx512f(auVar30,auVar32);
        auVar30 = vunpckhpd_avx512f(auVar30,auVar32);
        auVar32 = vunpcklpd_avx512f(auVar31,auVar33);
        auVar31 = vunpckhpd_avx512f(auVar31,auVar33);
        auVar33 = vunpcklpd_avx512f(auVar34,auVar36);
        auVar34 = vunpckhpd_avx512f(auVar34,auVar36);
        auVar36 = vunpcklpd_avx512f(auVar35,auVar37);
        auVar35 = vunpckhpd_avx512f(auVar35,auVar37);
        auVar37 = vshuff64x2_avx512f(auVar38,auVar33,0x88);
        auVar39 = vshuff64x2_avx512f(auVar30,auVar34,0x88);
        auVar40 = vshuff64x2_avx512f(auVar32,auVar36,0x88);
        auVar41 = vshuff64x2_avx512f(auVar31,auVar35,0x88);
        auVar33 = vshuff64x2_avx512f(auVar38,auVar33,0xdd);
        auVar30 = vshuff64x2_avx512f(auVar30,auVar34,0xdd);
        auVar32 = vshuff64x2_avx512f(auVar32,auVar36,0xdd);
        auVar31 = vshuff64x2_avx512f(auVar31,auVar35,0xdd);
        auVar34 = vshuff64x2_avx512f(auVar37,auVar39,0x88);
        auVar35 = vshuff64x2_avx512f(auVar40,auVar41,0x88);
        uStack_5288 = auVar35._56_8_;
        uStack_5290 = auVar35._48_8_;
        uStack_5298 = auVar35._40_8_;
        uStack_52a0 = auVar35._32_8_;
        uStack_52a8 = auVar35._24_8_;
        uStack_52b0 = auVar35._16_8_;
        uStack_52b8 = auVar35._8_8_;
        local_52c0 = auVar35._0_8_;
        auVar35 = vshuff64x2_avx512f(auVar33,auVar30,0x88);
        uStack_52c8 = auVar35._56_8_;
        uStack_52d0 = auVar35._48_8_;
        uStack_52d8 = auVar35._40_8_;
        uStack_52e0 = auVar35._32_8_;
        uStack_52e8 = auVar35._24_8_;
        uStack_52f0 = auVar35._16_8_;
        uStack_52f8 = auVar35._8_8_;
        local_5300 = auVar35._0_8_;
        auVar35 = vshuff64x2_avx512f(auVar32,auVar31,0x88);
        uStack_5308 = auVar35._56_8_;
        uStack_5310 = auVar35._48_8_;
        uStack_5318 = auVar35._40_8_;
        uStack_5320 = auVar35._32_8_;
        uStack_5328 = auVar35._24_8_;
        uStack_5330 = auVar35._16_8_;
        uStack_5338 = auVar35._8_8_;
        local_5340 = auVar35._0_8_;
        auVar35 = vshuff64x2_avx512f(auVar37,auVar39,0xdd);
        uStack_5348 = auVar35._56_8_;
        uStack_5350 = auVar35._48_8_;
        uStack_5358 = auVar35._40_8_;
        uStack_5360 = auVar35._32_8_;
        uStack_5368 = auVar35._24_8_;
        uStack_5370 = auVar35._16_8_;
        uStack_5378 = auVar35._8_8_;
        local_5380 = auVar35._0_8_;
        auVar35 = vshuff64x2_avx512f(auVar40,auVar41,0xdd);
        uStack_5388 = auVar35._56_8_;
        uStack_5390 = auVar35._48_8_;
        uStack_5398 = auVar35._40_8_;
        uStack_53a0 = auVar35._32_8_;
        uStack_53a8 = auVar35._24_8_;
        uStack_53b0 = auVar35._16_8_;
        uStack_53b8 = auVar35._8_8_;
        local_53c0 = auVar35._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar33,auVar30,0xdd);
        uStack_53c8 = auVar30._56_8_;
        uStack_53d0 = auVar30._48_8_;
        uStack_53d8 = auVar30._40_8_;
        uStack_53e0 = auVar30._32_8_;
        uStack_53e8 = auVar30._24_8_;
        uStack_53f0 = auVar30._16_8_;
        uStack_53f8 = auVar30._8_8_;
        local_5400 = auVar30._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar32,auVar31,0xdd);
        uStack_5248 = auVar34._56_8_;
        uStack_5250 = auVar34._48_8_;
        uStack_5258 = auVar34._40_8_;
        uStack_5260 = auVar34._32_8_;
        uStack_5268 = auVar34._24_8_;
        uStack_5270 = auVar34._16_8_;
        uStack_5278 = auVar34._8_8_;
        local_5280 = auVar34._0_8_;
        *(undefined8 *)*local_4b70 = local_5280;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5278;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_5270;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_5268;
        *(undefined8 *)(*local_4b70 + 0x20) = uStack_5260;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5258;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_5250;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_5248;
        *(undefined8 *)local_4b70[1] = local_52c0;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_52b8;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_52b0;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_52a8;
        *(undefined8 *)(local_4b70[1] + 0x20) = uStack_52a0;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_5298;
        *(undefined8 *)(local_4b70[1] + 0x30) = uStack_5290;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_5288;
        *(undefined8 *)local_4b70[2] = local_5300;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_52f8;
        *(undefined8 *)(local_4b70[2] + 0x10) = uStack_52f0;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_52e8;
        *(undefined8 *)(local_4b70[2] + 0x20) = uStack_52e0;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_52d8;
        *(undefined8 *)(local_4b70[2] + 0x30) = uStack_52d0;
        *(undefined8 *)(local_4b70[2] + 0x38) = uStack_52c8;
        *(undefined8 *)local_4b70[3] = local_5340;
        *(undefined8 *)(local_4b70[3] + 8) = uStack_5338;
        *(undefined8 *)(local_4b70[3] + 0x10) = uStack_5330;
        *(undefined8 *)(local_4b70[3] + 0x18) = uStack_5328;
        *(undefined8 *)(local_4b70[3] + 0x20) = uStack_5320;
        *(undefined8 *)(local_4b70[3] + 0x28) = uStack_5318;
        *(undefined8 *)(local_4b70[3] + 0x30) = uStack_5310;
        *(undefined8 *)(local_4b70[3] + 0x38) = uStack_5308;
        *(undefined8 *)local_4b70[4] = local_5380;
        *(undefined8 *)(local_4b70[4] + 8) = uStack_5378;
        *(undefined8 *)(local_4b70[4] + 0x10) = uStack_5370;
        *(undefined8 *)(local_4b70[4] + 0x18) = uStack_5368;
        *(undefined8 *)(local_4b70[4] + 0x20) = uStack_5360;
        *(undefined8 *)(local_4b70[4] + 0x28) = uStack_5358;
        *(undefined8 *)(local_4b70[4] + 0x30) = uStack_5350;
        *(undefined8 *)(local_4b70[4] + 0x38) = uStack_5348;
        *(undefined8 *)local_4b70[5] = local_53c0;
        *(undefined8 *)(local_4b70[5] + 8) = uStack_53b8;
        *(undefined8 *)(local_4b70[5] + 0x10) = uStack_53b0;
        *(undefined8 *)(local_4b70[5] + 0x18) = uStack_53a8;
        *(undefined8 *)(local_4b70[5] + 0x20) = uStack_53a0;
        *(undefined8 *)(local_4b70[5] + 0x28) = uStack_5398;
        *(undefined8 *)(local_4b70[5] + 0x30) = uStack_5390;
        *(undefined8 *)(local_4b70[5] + 0x38) = uStack_5388;
        *(undefined8 *)local_4b70[6] = local_5400;
        *(undefined8 *)(local_4b70[6] + 8) = uStack_53f8;
        *(undefined8 *)(local_4b70[6] + 0x10) = uStack_53f0;
        *(undefined8 *)(local_4b70[6] + 0x18) = uStack_53e8;
        *(undefined8 *)(local_4b70[6] + 0x20) = uStack_53e0;
        *(undefined8 *)(local_4b70[6] + 0x28) = uStack_53d8;
        *(undefined8 *)(local_4b70[6] + 0x30) = uStack_53d0;
        *(undefined8 *)(local_4b70[6] + 0x38) = uStack_53c8;
        local_4b70[7] = auVar30;
        local_4b70 = local_4b70 + 8;
        local_5208 = (undefined1 (*) [64])(*local_5208 + (long)(local_5ac0 << 4) * 4);
      }
    }
    if (iVar1 == 8) {
      local_5448 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 8) * 4);
      for (local_544c = 0; local_544c + 7 < in_R9D; local_544c = local_544c + 8) {
        auVar23 = vunpcklps_avx(*local_5448,local_5448[1]);
        auVar6 = vunpckhps_avx(*local_5448,local_5448[1]);
        auVar11 = vunpcklps_avx(local_5448[2],local_5448[3]);
        auVar7 = vunpckhps_avx(local_5448[2],local_5448[3]);
        auVar24 = vunpcklps_avx(local_5448[4],local_5448[5]);
        auVar8 = vunpckhps_avx(local_5448[4],local_5448[5]);
        auVar18 = vunpcklps_avx(local_5448[6],local_5448[7]);
        auVar9 = vunpckhps_avx(local_5448[6],local_5448[7]);
        auVar10 = vunpcklpd_avx(auVar23,auVar11);
        auVar23 = vunpckhpd_avx(auVar23,auVar11);
        auVar11 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar17 = vunpcklpd_avx(auVar24,auVar18);
        auVar7 = vunpckhpd_avx(auVar24,auVar18);
        auVar24 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar9 = vperm2f128_avx(auVar10,auVar17,0x20);
        auVar18 = vperm2f128_avx(auVar23,auVar7,0x20);
        uStack_5488 = auVar18._24_8_;
        uStack_5490 = auVar18._16_8_;
        uStack_5498 = auVar18._8_8_;
        local_54a0 = auVar18._0_8_;
        auVar18 = vperm2f128_avx(auVar11,auVar24,0x20);
        uStack_54a8 = auVar18._24_8_;
        uStack_54b0 = auVar18._16_8_;
        uStack_54b8 = auVar18._8_8_;
        local_54c0 = auVar18._0_8_;
        auVar18 = vperm2f128_avx(auVar6,auVar8,0x20);
        uStack_54c8 = auVar18._24_8_;
        uStack_54d0 = auVar18._16_8_;
        uStack_54d8 = auVar18._8_8_;
        local_54e0 = auVar18._0_8_;
        auVar10 = vperm2f128_avx(auVar10,auVar17,0x31);
        uStack_54e8 = auVar10._24_8_;
        uStack_54f0 = auVar10._16_8_;
        uStack_54f8 = auVar10._8_8_;
        local_5500 = auVar10._0_8_;
        auVar23 = vperm2f128_avx(auVar23,auVar7,0x31);
        uStack_5508 = auVar23._24_8_;
        uStack_5510 = auVar23._16_8_;
        uStack_5518 = auVar23._8_8_;
        local_5520 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar11,auVar24,0x31);
        uStack_5528 = auVar23._24_8_;
        uStack_5530 = auVar23._16_8_;
        uStack_5538 = auVar23._8_8_;
        local_5540 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar6,auVar8,0x31);
        uStack_5468 = auVar9._24_8_;
        uStack_5470 = auVar9._16_8_;
        uStack_5478 = auVar9._8_8_;
        local_5480 = auVar9._0_8_;
        *(undefined8 *)*local_4b70 = local_5480;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5478;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_5470;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_5468;
        *(undefined8 *)(*local_4b70 + 0x20) = local_54a0;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5498;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_5490;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_5488;
        *(undefined8 *)local_4b70[1] = local_54c0;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_54b8;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_54b0;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_54a8;
        *(undefined8 *)(local_4b70[1] + 0x20) = local_54e0;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_54d8;
        *(undefined8 *)(local_4b70[1] + 0x30) = uStack_54d0;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_54c8;
        *(undefined8 *)local_4b70[2] = local_5500;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_54f8;
        *(undefined8 *)(local_4b70[2] + 0x10) = uStack_54f0;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_54e8;
        *(undefined8 *)(local_4b70[2] + 0x20) = local_5520;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_5518;
        *(undefined8 *)(local_4b70[2] + 0x30) = uStack_5510;
        *(undefined8 *)(local_4b70[2] + 0x38) = uStack_5508;
        *(undefined8 *)local_4b70[3] = local_5540;
        *(undefined8 *)(local_4b70[3] + 8) = uStack_5538;
        *(undefined8 *)(local_4b70[3] + 0x10) = uStack_5530;
        *(undefined8 *)(local_4b70[3] + 0x18) = uStack_5528;
        *(undefined1 (*) [32])(local_4b70[3] + 0x20) = auVar23;
        local_4b70 = local_4b70 + 4;
        local_5448 = (undefined1 (*) [32])(*local_5448 + (long)(local_5ac0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_5568 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 4) * 4);
      for (local_556c = 0; local_556c + 3 < in_R9D; local_556c = local_556c + 4) {
        auVar19 = vunpcklps_avx(*local_5568,local_5568[1]);
        auVar20 = vunpcklps_avx(local_5568[2],local_5568[3]);
        auVar2 = vunpckhps_avx(*local_5568,local_5568[1]);
        auVar3 = vunpckhps_avx(local_5568[2],local_5568[3]);
        auVar21 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar5 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(local_5568[4],local_5568[5]);
        auVar13 = vunpcklps_avx(local_5568[6],local_5568[7]);
        auVar20 = vunpckhps_avx(local_5568[4],local_5568[5]);
        auVar4 = vunpckhps_avx(local_5568[6],local_5568[7]);
        auVar12 = vunpcklpd_avx(auVar3,auVar13);
        auVar3 = vunpckhpd_avx(auVar3,auVar13);
        auVar13 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        local_5580 = auVar21._0_8_;
        uStack_5578 = auVar21._8_8_;
        *(undefined8 *)*local_4b70 = local_5580;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5578;
        local_55c0 = auVar12._0_8_;
        uStack_55b8 = auVar12._8_8_;
        *(undefined8 *)(*local_4b70 + 0x10) = local_55c0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_55b8;
        local_5590 = auVar19._0_8_;
        uStack_5588 = auVar19._8_8_;
        *(undefined8 *)(*local_4b70 + 0x20) = local_5590;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5588;
        local_55d0 = auVar3._0_8_;
        uStack_55c8 = auVar3._8_8_;
        *(undefined8 *)(*local_4b70 + 0x30) = local_55d0;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_55c8;
        local_55a0 = auVar5._0_8_;
        uStack_5598 = auVar5._8_8_;
        *(undefined8 *)local_4b70[1] = local_55a0;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_5598;
        local_55e0 = auVar13._0_8_;
        uStack_55d8 = auVar13._8_8_;
        *(undefined8 *)(local_4b70[1] + 0x10) = local_55e0;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_55d8;
        local_55b0 = auVar2._0_8_;
        uStack_55a8 = auVar2._8_8_;
        *(undefined8 *)(local_4b70[1] + 0x20) = local_55b0;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_55a8;
        *(undefined1 (*) [16])(local_4b70[1] + 0x30) = auVar20;
        local_4b70 = local_4b70 + 2;
        local_5568 = (undefined1 (*) [16])(*local_5568 + (long)(local_5ac0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_5678 = (undefined8 *)
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 + (long)(in_EDX + local_4b74) * 4);
      for (local_567c = 0; local_567c < in_R9D; local_567c = local_567c + 1) {
        uVar29 = local_5678[1];
        *(undefined8 *)*local_4b70 = *local_5678;
        *(undefined8 *)(*local_4b70 + 8) = uVar29;
        *(undefined1 (*) [16])(*local_4b70 + 0x10) = *(undefined1 (*) [16])(local_5678 + 2);
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x20);
        local_5678 = (undefined8 *)((long)local_5678 + (long)local_5ac0 * 4);
      }
    }
  }
  for (; local_4b74 + 3 < in_ECX; local_4b74 = local_4b74 + 4) {
    if (iVar1 == 0x10) {
      local_5688 = (undefined1 (*) [64])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 0x10) * 4);
      for (local_568c = 0; local_568c + 0xf < in_R9D; local_568c = local_568c + 0x10) {
        auVar30 = vunpcklps_avx512f(*local_5688,local_5688[1]);
        auVar31 = vunpckhps_avx512f(*local_5688,local_5688[1]);
        auVar32 = vunpcklps_avx512f(local_5688[2],local_5688[3]);
        auVar33 = vunpckhps_avx512f(local_5688[2],local_5688[3]);
        auVar34 = vunpcklpd_avx512f(auVar30,auVar32);
        auVar30 = vunpckhpd_avx512f(auVar30,auVar32);
        auVar32 = vunpcklpd_avx512f(auVar31,auVar33);
        auVar31 = vunpckhpd_avx512f(auVar31,auVar33);
        auVar33 = vshuff64x2_avx512f(auVar34,auVar30,0x88);
        auVar35 = vshuff64x2_avx512f(auVar32,auVar31,0x88);
        auVar30 = vshuff64x2_avx512f(auVar34,auVar30,0xdd);
        auVar31 = vshuff64x2_avx512f(auVar32,auVar31,0xdd);
        auVar32 = vshuff64x2_avx512f(auVar33,auVar35,0x88);
        auVar34 = vshuff64x2_avx512f(auVar30,auVar31,0x88);
        uStack_5708 = auVar34._56_8_;
        uStack_5710 = auVar34._48_8_;
        uStack_5718 = auVar34._40_8_;
        uStack_5720 = auVar34._32_8_;
        uStack_5728 = auVar34._24_8_;
        uStack_5730 = auVar34._16_8_;
        uStack_5738 = auVar34._8_8_;
        local_5740 = auVar34._0_8_;
        auVar33 = vshuff64x2_avx512f(auVar33,auVar35,0xdd);
        uStack_5748 = auVar33._56_8_;
        uStack_5750 = auVar33._48_8_;
        uStack_5758 = auVar33._40_8_;
        uStack_5760 = auVar33._32_8_;
        uStack_5768 = auVar33._24_8_;
        uStack_5770 = auVar33._16_8_;
        uStack_5778 = auVar33._8_8_;
        local_5780 = auVar33._0_8_;
        auVar30 = vshuff64x2_avx512f(auVar30,auVar31,0xdd);
        uStack_56c8 = auVar32._56_8_;
        uStack_56d0 = auVar32._48_8_;
        uStack_56d8 = auVar32._40_8_;
        uStack_56e0 = auVar32._32_8_;
        uStack_56e8 = auVar32._24_8_;
        uStack_56f0 = auVar32._16_8_;
        uStack_56f8 = auVar32._8_8_;
        local_5700 = auVar32._0_8_;
        *(undefined8 *)*local_4b70 = local_5700;
        *(undefined8 *)(*local_4b70 + 8) = uStack_56f8;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_56f0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_56e8;
        *(undefined8 *)(*local_4b70 + 0x20) = uStack_56e0;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_56d8;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_56d0;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_56c8;
        *(undefined8 *)local_4b70[1] = local_5740;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_5738;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_5730;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_5728;
        *(undefined8 *)(local_4b70[1] + 0x20) = uStack_5720;
        *(undefined8 *)(local_4b70[1] + 0x28) = uStack_5718;
        *(undefined8 *)(local_4b70[1] + 0x30) = uStack_5710;
        *(undefined8 *)(local_4b70[1] + 0x38) = uStack_5708;
        *(undefined8 *)local_4b70[2] = local_5780;
        *(undefined8 *)(local_4b70[2] + 8) = uStack_5778;
        *(undefined8 *)(local_4b70[2] + 0x10) = uStack_5770;
        *(undefined8 *)(local_4b70[2] + 0x18) = uStack_5768;
        *(undefined8 *)(local_4b70[2] + 0x20) = uStack_5760;
        *(undefined8 *)(local_4b70[2] + 0x28) = uStack_5758;
        *(undefined8 *)(local_4b70[2] + 0x30) = uStack_5750;
        *(undefined8 *)(local_4b70[2] + 0x38) = uStack_5748;
        local_4b70[3] = auVar30;
        local_4b70 = local_4b70 + 4;
        local_5688 = (undefined1 (*) [64])(*local_5688 + (long)(local_5ac0 << 4) * 4);
      }
    }
    if (iVar1 == 8) {
      local_57c8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 8) * 4);
      for (local_57cc = 0; local_57cc + 7 < in_R9D; local_57cc = local_57cc + 8) {
        auVar23 = vunpcklps_avx(*local_57c8,local_57c8[1]);
        auVar6 = vunpckhps_avx(*local_57c8,local_57c8[1]);
        auVar9 = vunpcklps_avx(local_57c8[2],local_57c8[3]);
        auVar7 = vunpckhps_avx(local_57c8[2],local_57c8[3]);
        auVar8 = vunpcklpd_avx(auVar23,auVar9);
        auVar23 = vunpckhpd_avx(auVar23,auVar9);
        auVar9 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar7 = vperm2f128_avx(auVar8,auVar23,0x20);
        auVar10 = vperm2f128_avx(auVar9,auVar6,0x20);
        uStack_5808 = auVar10._24_8_;
        uStack_5810 = auVar10._16_8_;
        uStack_5818 = auVar10._8_8_;
        local_5820 = auVar10._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar23,0x31);
        uStack_5828 = auVar23._24_8_;
        uStack_5830 = auVar23._16_8_;
        uStack_5838 = auVar23._8_8_;
        local_5840 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar9,auVar6,0x31);
        uStack_57e8 = auVar7._24_8_;
        uStack_57f0 = auVar7._16_8_;
        uStack_57f8 = auVar7._8_8_;
        local_5800 = auVar7._0_8_;
        *(undefined8 *)*local_4b70 = local_5800;
        *(undefined8 *)(*local_4b70 + 8) = uStack_57f8;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_57f0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_57e8;
        *(undefined8 *)(*local_4b70 + 0x20) = local_5820;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5818;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_5810;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_5808;
        *(undefined8 *)local_4b70[1] = local_5840;
        *(undefined8 *)(local_4b70[1] + 8) = uStack_5838;
        *(undefined8 *)(local_4b70[1] + 0x10) = uStack_5830;
        *(undefined8 *)(local_4b70[1] + 0x18) = uStack_5828;
        *(undefined1 (*) [32])(local_4b70[1] + 0x20) = auVar23;
        local_4b70 = local_4b70 + 2;
        local_57c8 = (undefined1 (*) [32])(*local_57c8 + (long)(local_5ac0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_5868 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 4) * 4);
      for (local_586c = 0; local_586c + 3 < in_R9D; local_586c = local_586c + 4) {
        auVar19 = vunpcklps_avx(*local_5868,local_5868[1]);
        auVar4 = vunpcklps_avx(local_5868[2],local_5868[3]);
        auVar2 = vunpckhps_avx(*local_5868,local_5868[1]);
        auVar3 = vunpckhps_avx(local_5868[2],local_5868[3]);
        auVar20 = vunpcklpd_avx(auVar19,auVar4);
        auVar19 = vunpckhpd_avx(auVar19,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_5880 = auVar20._0_8_;
        uStack_5878 = auVar20._8_8_;
        *(undefined8 *)*local_4b70 = local_5880;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5878;
        local_5890 = auVar19._0_8_;
        uStack_5888 = auVar19._8_8_;
        *(undefined8 *)(*local_4b70 + 0x10) = local_5890;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_5888;
        local_58a0 = auVar4._0_8_;
        uStack_5898 = auVar4._8_8_;
        *(undefined8 *)(*local_4b70 + 0x20) = local_58a0;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5898;
        *(undefined1 (*) [16])(*local_4b70 + 0x30) = auVar2;
        local_4b70 = local_4b70 + 1;
        local_5868 = (undefined1 (*) [16])(*local_5868 + (long)(local_5ac0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_58f8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 + (long)(in_EDX + local_4b74) * 4);
      for (local_58fc = 0; local_58fc < in_R9D; local_58fc = local_58fc + 1) {
        *(undefined1 (*) [16])*local_4b70 = *local_58f8;
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x10);
        local_58f8 = (undefined1 (*) [16])(*local_58f8 + (long)local_5ac0 * 4);
      }
    }
  }
  for (; local_4b74 + 1 < in_ECX; local_4b74 = local_4b74 + 2) {
    if (iVar1 == 0x10) {
      local_5908 = (undefined1 (*) [64])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 0x10) * 4);
      for (local_590c = 0; local_590c + 0xf < in_R9D; local_590c = local_590c + 0x10) {
        auVar30 = vunpcklps_avx512f(*local_5908,local_5908[1]);
        auVar31 = vunpckhps_avx512f(*local_5908,local_5908[1]);
        auVar32 = vshuff64x2_avx512f(auVar30,auVar31,0x88);
        auVar30 = vshuff64x2_avx512f(auVar30,auVar31,0xdd);
        auVar31 = vshuff64x2_avx512f(auVar32,auVar30,0x88);
        auVar30 = vshuff64x2_avx512f(auVar32,auVar30,0xdd);
        uStack_5948 = auVar31._56_8_;
        uStack_5950 = auVar31._48_8_;
        uStack_5958 = auVar31._40_8_;
        uStack_5960 = auVar31._32_8_;
        uStack_5968 = auVar31._24_8_;
        uStack_5970 = auVar31._16_8_;
        uStack_5978 = auVar31._8_8_;
        local_5980 = auVar31._0_8_;
        *(undefined8 *)*local_4b70 = local_5980;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5978;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_5970;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_5968;
        *(undefined8 *)(*local_4b70 + 0x20) = uStack_5960;
        *(undefined8 *)(*local_4b70 + 0x28) = uStack_5958;
        *(undefined8 *)(*local_4b70 + 0x30) = uStack_5950;
        *(undefined8 *)(*local_4b70 + 0x38) = uStack_5948;
        local_4b70[1] = auVar30;
        local_4b70 = local_4b70 + 2;
        local_5908 = (undefined1 (*) [64])(*local_5908 + (long)(local_5ac0 << 4) * 4);
      }
    }
    if (iVar1 == 8) {
      local_59c8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 8) * 4);
      for (local_59cc = 0; local_59cc + 7 < in_R9D; local_59cc = local_59cc + 8) {
        auVar6 = vunpcklps_avx(*local_59c8,local_59c8[1]);
        auVar23 = vunpckhps_avx(*local_59c8,local_59c8[1]);
        auVar7 = vperm2f128_avx(auVar6,auVar23,0x20);
        auVar23 = vperm2f128_avx(auVar6,auVar23,0x31);
        uStack_59e8 = auVar7._24_8_;
        uStack_59f0 = auVar7._16_8_;
        uStack_59f8 = auVar7._8_8_;
        local_5a00 = auVar7._0_8_;
        *(undefined8 *)*local_4b70 = local_5a00;
        *(undefined8 *)(*local_4b70 + 8) = uStack_59f8;
        *(undefined8 *)(*local_4b70 + 0x10) = uStack_59f0;
        *(undefined8 *)(*local_4b70 + 0x18) = uStack_59e8;
        *(undefined1 (*) [32])(*local_4b70 + 0x20) = auVar23;
        local_4b70 = local_4b70 + 1;
        local_59c8 = (undefined1 (*) [32])(*local_59c8 + (long)(local_5ac0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_5a28 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 4) * 4);
      for (local_5a2c = 0; local_5a2c + 3 < in_R9D; local_5a2c = local_5a2c + 4) {
        auVar2 = vunpcklps_avx(*local_5a28,local_5a28[1]);
        auVar19 = vunpckhps_avx(*local_5a28,local_5a28[1]);
        local_5a60 = auVar2._0_8_;
        uStack_5a58 = auVar2._8_8_;
        *(undefined8 *)*local_4b70 = local_5a60;
        *(undefined8 *)(*local_4b70 + 8) = uStack_5a58;
        *(undefined1 (*) [16])(*local_4b70 + 0x10) = auVar19;
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x20);
        local_5a28 = (undefined1 (*) [16])(*local_5a28 + (long)(local_5ac0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_5a78 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 + (long)(in_EDX + local_4b74) * 4);
      for (local_5a7c = 0; local_5a7c < in_R9D; local_5a7c = local_5a7c + 1) {
        *(undefined4 *)*local_4b70 = *local_5a78;
        *(undefined4 *)(*local_4b70 + 4) = local_5a78[1];
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 8);
        local_5a78 = local_5a78 + local_5ac0;
      }
    }
  }
  for (; local_4b74 < in_ECX; local_4b74 = local_4b74 + 1) {
    if (iVar1 == 0x10) {
      local_5a88 = (undefined1 (*) [64])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 0x10) * 4);
      for (local_5a8c = 0; local_5a8c + 0xf < in_R9D; local_5a8c = local_5a8c + 0x10) {
        *local_4b70 = *local_5a88;
        local_4b70 = local_4b70 + 1;
        local_5a88 = (undefined1 (*) [64])(*local_5a88 + (long)(local_5ac0 << 4) * 4);
      }
    }
    if (iVar1 == 8) {
      local_5a98 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 8) * 4);
      for (local_5a9c = 0; local_5a9c + 7 < in_R9D; local_5a9c = local_5a9c + 8) {
        *(undefined1 (*) [32])*local_4b70 = *local_5a98;
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x20);
        local_5a98 = (undefined1 (*) [32])(*local_5a98 + (long)(local_5ac0 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_5aa8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 +
                   (long)((in_EDX + local_4b74) * 4) * 4);
      for (local_5aac = 0; local_5aac + 3 < in_R9D; local_5aac = local_5aac + 4) {
        *(undefined1 (*) [16])*local_4b70 = *local_5aa8;
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 0x10);
        local_5aa8 = (undefined1 (*) [16])(*local_5aa8 + (long)(local_5ac0 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_5ab8 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_5ac0) * 4 + (long)(in_EDX + local_4b74) * 4);
      for (local_5abc = 0; local_5abc < in_R9D; local_5abc = local_5abc + 1) {
        *(undefined4 *)*local_4b70 = *local_5ab8;
        local_4b70 = (undefined1 (*) [64])(*local_4b70 + 4);
        local_5ab8 = local_5ab8 + local_5ac0;
      }
    }
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}